

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O1

void h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  jpeg_upsampler *pjVar5;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var6;
  long lVar7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var9;
  long lVar10;
  JSAMPLE *pJVar11;
  JSAMPROW pJVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  uint uVar16;
  int iVar18;
  byte *pbVar17;
  long lVar19;
  long lVar20;
  long lVar21;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        bVar1 = *pbVar15;
        pbVar15 = pbVar15 + 1;
        bVar2 = *pbVar17;
        pbVar17 = pbVar17 + 1;
        lVar19 = (long)*(int *)(p_Var6 + (ulong)bVar2 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)bVar2 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)bVar1 * 8);
        lVar21 = (long)*(int *)(lVar7 + (ulong)bVar1 * 4);
        uVar13 = (ulong)*pbVar14;
        *pJVar12 = pJVar11[lVar19 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[1] = pJVar11[lVar20 + uVar13];
        pJVar12[2] = pJVar11[uVar13 + lVar21];
        uVar13 = (ulong)pbVar14[1];
        pbVar14 = pbVar14 + 2;
        pJVar12[3] = pJVar11[lVar19 + uVar13];
        pJVar12[4] = pJVar11[lVar20 + uVar13];
        pJVar12[5] = pJVar11[lVar21 + uVar13];
        pJVar12 = pJVar12 + 6;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    iVar3 = *(int *)(p_Var6 + (ulong)*pbVar17 * 4);
    iVar18 = (int)((ulong)(*(long *)(p_Var8 + (ulong)*pbVar17 * 8) +
                          *(long *)(p_Var9 + (ulong)*pbVar15 * 8)) >> 0x10);
    iVar4 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        lVar21 = (long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
        lVar19 = (long)*(int *)(lVar7 + (ulong)*pbVar15 * 4);
        uVar13 = (ulong)*pbVar14;
        *pJVar12 = pJVar11[lVar21 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[1] = pJVar11[uVar13 + lVar20];
        pJVar12[2] = pJVar11[uVar13 + lVar19];
        pJVar12[3] = 0xff;
        uVar13 = (ulong)pbVar14[1];
        pJVar12[4] = pJVar11[lVar21 + uVar13];
        pJVar12[5] = pJVar11[lVar20 + uVar13];
        pJVar12[6] = pJVar11[lVar19 + uVar13];
        pbVar15 = pbVar15 + 1;
        pbVar17 = pbVar17 + 1;
        pbVar14 = pbVar14 + 2;
        pJVar12[7] = 0xff;
        pJVar12 = pJVar12 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
    lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
    iVar3 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
    uVar13 = (ulong)*pbVar14;
    *pJVar12 = pJVar11[(long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4) + uVar13];
    pJVar12[1] = pJVar11[(long)(int)((ulong)(lVar20 + lVar10) >> 0x10) + uVar13];
    pJVar12[2] = pJVar11[(long)iVar3 + uVar13];
    goto LAB_001242ab;
  case JCS_EXT_BGR:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        bVar1 = *pbVar15;
        pbVar15 = pbVar15 + 1;
        bVar2 = *pbVar17;
        pbVar17 = pbVar17 + 1;
        lVar21 = (long)*(int *)(p_Var6 + (ulong)bVar2 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)bVar2 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)bVar1 * 8);
        lVar19 = (long)*(int *)(lVar7 + (ulong)bVar1 * 4);
        uVar13 = (ulong)*pbVar14;
        pJVar12[2] = pJVar11[lVar21 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[1] = pJVar11[uVar13 + lVar20];
        *pJVar12 = pJVar11[uVar13 + lVar19];
        uVar13 = (ulong)pbVar14[1];
        pbVar14 = pbVar14 + 2;
        pJVar12[5] = pJVar11[lVar21 + uVar13];
        pJVar12[4] = pJVar11[lVar20 + uVar13];
        pJVar12[3] = pJVar11[lVar19 + uVar13];
        pJVar12 = pJVar12 + 6;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
    lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
    iVar3 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
    uVar13 = (ulong)*pbVar14;
    pJVar12[2] = pJVar11[(long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4) + uVar13];
    pJVar12[1] = pJVar11[(long)(int)((ulong)(lVar20 + lVar10) >> 0x10) + uVar13];
    *pJVar12 = pJVar11[(long)iVar3 + uVar13];
    return;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        lVar21 = (long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
        lVar19 = (long)*(int *)(lVar7 + (ulong)*pbVar15 * 4);
        uVar13 = (ulong)*pbVar14;
        pJVar12[2] = pJVar11[lVar21 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[1] = pJVar11[uVar13 + lVar20];
        *pJVar12 = pJVar11[uVar13 + lVar19];
        pJVar12[3] = 0xff;
        uVar13 = (ulong)pbVar14[1];
        pJVar12[6] = pJVar11[lVar21 + uVar13];
        pJVar12[5] = pJVar11[lVar20 + uVar13];
        pJVar12[4] = pJVar11[lVar19 + uVar13];
        pbVar15 = pbVar15 + 1;
        pbVar17 = pbVar17 + 1;
        pbVar14 = pbVar14 + 2;
        pJVar12[7] = 0xff;
        pJVar12 = pJVar12 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
    lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
    iVar3 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
    uVar13 = (ulong)*pbVar14;
    pJVar12[2] = pJVar11[(long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4) + uVar13];
    pJVar12[1] = pJVar11[(long)(int)((ulong)(lVar20 + lVar10) >> 0x10) + uVar13];
    *pJVar12 = pJVar11[(long)iVar3 + uVar13];
LAB_001242ab:
    pJVar12[3] = 0xff;
    return;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        lVar21 = (long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
        lVar19 = (long)*(int *)(lVar7 + (ulong)*pbVar15 * 4);
        uVar13 = (ulong)*pbVar14;
        pJVar12[3] = pJVar11[lVar21 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[2] = pJVar11[uVar13 + lVar20];
        pJVar12[1] = pJVar11[uVar13 + lVar19];
        *pJVar12 = 0xff;
        uVar13 = (ulong)pbVar14[1];
        pJVar12[7] = pJVar11[lVar21 + uVar13];
        pJVar12[6] = pJVar11[lVar20 + uVar13];
        pJVar12[5] = pJVar11[lVar19 + uVar13];
        pbVar15 = pbVar15 + 1;
        pbVar17 = pbVar17 + 1;
        pbVar14 = pbVar14 + 2;
        pJVar12[4] = 0xff;
        pJVar12 = pJVar12 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
    lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
    iVar3 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
    uVar13 = (ulong)*pbVar14;
    pJVar12[3] = pJVar11[(long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4) + uVar13];
    pJVar12[2] = pJVar11[(long)(int)((ulong)(lVar20 + lVar10) >> 0x10) + uVar13];
    pJVar12[1] = pJVar11[(long)iVar3 + uVar13];
    goto LAB_001243fa;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        lVar21 = (long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
        lVar19 = (long)*(int *)(lVar7 + (ulong)*pbVar15 * 4);
        uVar13 = (ulong)*pbVar14;
        pJVar12[1] = pJVar11[lVar21 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[2] = pJVar11[uVar13 + lVar20];
        pJVar12[3] = pJVar11[uVar13 + lVar19];
        *pJVar12 = 0xff;
        uVar13 = (ulong)pbVar14[1];
        pJVar12[5] = pJVar11[lVar21 + uVar13];
        pJVar12[6] = pJVar11[lVar20 + uVar13];
        pJVar12[7] = pJVar11[lVar19 + uVar13];
        pbVar15 = pbVar15 + 1;
        pbVar17 = pbVar17 + 1;
        pbVar14 = pbVar14 + 2;
        pJVar12[4] = 0xff;
        pJVar12 = pJVar12 + 8;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    lVar20 = *(long *)(p_Var8 + (ulong)*pbVar17 * 8);
    lVar10 = *(long *)(p_Var9 + (ulong)*pbVar15 * 8);
    iVar3 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
    uVar13 = (ulong)*pbVar14;
    pJVar12[1] = pJVar11[(long)*(int *)(p_Var6 + (ulong)*pbVar17 * 4) + uVar13];
    pJVar12[2] = pJVar11[(long)(int)((ulong)(lVar20 + lVar10) >> 0x10) + uVar13];
    pJVar12[3] = pJVar11[(long)iVar3 + uVar13];
LAB_001243fa:
    *pJVar12 = 0xff;
    return;
  default:
    pjVar5 = cinfo->upsample;
    pJVar11 = cinfo->sample_range_limit;
    p_Var6 = pjVar5[1].upsample;
    lVar7 = *(long *)&pjVar5[1].need_context_rows;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].upsample;
    pbVar14 = (*input_buf)[in_row_group_ctr];
    pbVar15 = input_buf[1][in_row_group_ctr];
    pbVar17 = input_buf[2][in_row_group_ctr];
    pJVar12 = *output_buf;
    if (1 < cinfo->output_width) {
      uVar16 = cinfo->output_width >> 1;
      do {
        bVar1 = *pbVar15;
        pbVar15 = pbVar15 + 1;
        bVar2 = *pbVar17;
        pbVar17 = pbVar17 + 1;
        lVar21 = (long)*(int *)(p_Var6 + (ulong)bVar2 * 4);
        lVar20 = *(long *)(p_Var8 + (ulong)bVar2 * 8);
        lVar10 = *(long *)(p_Var9 + (ulong)bVar1 * 8);
        lVar19 = (long)*(int *)(lVar7 + (ulong)bVar1 * 4);
        uVar13 = (ulong)*pbVar14;
        *pJVar12 = pJVar11[lVar21 + uVar13];
        lVar20 = (long)(int)((ulong)(lVar20 + lVar10) >> 0x10);
        pJVar12[1] = pJVar11[uVar13 + lVar20];
        pJVar12[2] = pJVar11[uVar13 + lVar19];
        uVar13 = (ulong)pbVar14[1];
        pbVar14 = pbVar14 + 2;
        pJVar12[3] = pJVar11[lVar21 + uVar13];
        pJVar12[4] = pJVar11[lVar20 + uVar13];
        pJVar12[5] = pJVar11[lVar19 + uVar13];
        pJVar12 = pJVar12 + 6;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    if ((cinfo->output_width & 1) == 0) {
      return;
    }
    iVar3 = *(int *)(p_Var6 + (ulong)*pbVar17 * 4);
    iVar18 = (int)((ulong)(*(long *)(p_Var8 + (ulong)*pbVar17 * 8) +
                          *(long *)(p_Var9 + (ulong)*pbVar15 * 8)) >> 0x10);
    iVar4 = *(int *)(lVar7 + (ulong)*pbVar15 * 4);
  }
  uVar13 = (ulong)*pbVar14;
  *pJVar12 = pJVar11[(long)iVar3 + uVar13];
  pJVar12[1] = pJVar11[(long)iVar18 + uVar13];
  pJVar12[2] = pJVar11[(long)iVar4 + uVar13];
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    extrgb_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_BGR:
    extbgr_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                         output_buf);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                          output_buf);
    break;
  default:
    h2v1_merged_upsample_internal(cinfo, input_buf, in_row_group_ctr,
                                  output_buf);
    break;
  }
}